

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_continueCCtx(ZSTD_CCtx *cctx,ZSTD_CCtx_params params,U64 pledgedSrcSize)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ZSTD_strategy ZVar3;
  U32 UVar4;
  undefined1 auVar5 [120];
  byte bVar6;
  size_t local_50;
  U64 local_48;
  ulong local_40;
  U64 local_38;
  size_t blockSize;
  size_t windowSize;
  U64 pledgedSrcSize_local;
  ZSTD_CCtx *cctx_local;
  
  bVar6 = (byte)params.cParams.windowLog;
  local_38 = pledgedSrcSize;
  if ((ulong)(1L << (bVar6 & 0x3f)) < pledgedSrcSize) {
    local_38 = 1L << (bVar6 & 0x3f);
  }
  if (local_38 == 0) {
    local_40 = 1;
  }
  else {
    local_48 = pledgedSrcSize;
    if ((ulong)(1L << (bVar6 & 0x3f)) < pledgedSrcSize) {
      local_48 = 1L << (bVar6 & 0x3f);
    }
    local_40 = local_48;
  }
  if (local_40 < 0x20001) {
    local_50 = local_40;
  }
  else {
    local_50 = 0x20000;
  }
  cctx->blockSize = local_50;
  uVar1 = params.cParams._16_8_;
  uVar2 = params.cParams._8_8_;
  ZVar3 = params.cParams.strategy;
  UVar4 = params.ldmParams.enableLdm;
  params._8_120_ = params._8_120_;
  auVar5 = (undefined1  [120])params._8_120_;
  params.cParams._8_8_ = uVar2;
  params.cParams._16_8_ = uVar1;
  params.cParams.strategy = ZVar3;
  params.ldmParams.enableLdm = UVar4;
  memcpy(&cctx->appliedParams,&params,0x80);
  auVar5 = (undefined1  [120])params._8_120_;
  (cctx->blockState).matchState.cParams.windowLog = params.cParams.windowLog;
  (cctx->blockState).matchState.cParams.chainLog = auVar5._0_4_;
  (cctx->blockState).matchState.cParams.hashLog = params.cParams.hashLog;
  (cctx->blockState).matchState.cParams.searchLog = params.cParams.searchLog;
  (cctx->blockState).matchState.cParams.minMatch = params.cParams.minMatch;
  (cctx->blockState).matchState.cParams.targetLength = params.cParams.targetLength;
  (cctx->blockState).matchState.cParams.strategy = params.cParams.strategy;
  cctx->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  cctx->consumedSrcSize = 0;
  cctx->producedCSize = 0;
  if (pledgedSrcSize == 0xffffffffffffffff) {
    (cctx->appliedParams).fParams.contentSizeFlag = 0;
  }
  cctx->stage = ZSTDcs_init;
  cctx->dictID = 0;
  if (params.ldmParams.enableLdm != 0) {
    uVar1 = params.cParams._16_8_;
    uVar2 = params.cParams._8_8_;
    ZVar3 = params.cParams.strategy;
    UVar4 = params.ldmParams.enableLdm;
    params._8_120_ = auVar5;
    auVar5 = (undefined1  [120])params._8_120_;
    params.cParams._8_8_ = uVar2;
    params.cParams._16_8_ = uVar1;
    params.cParams.strategy = ZVar3;
    params.ldmParams.enableLdm = UVar4;
    ZSTD_window_clear(&(cctx->ldmState).window);
    auVar5 = (undefined1  [120])params._8_120_;
  }
  params._8_120_ = auVar5;
  UVar4 = params.ldmParams.enableLdm;
  ZVar3 = params.cParams.strategy;
  uVar2 = params.cParams._16_8_;
  uVar1 = params.cParams._8_8_;
  auVar5 = (undefined1  [120])params._8_120_;
  params.cParams._8_8_ = uVar1;
  params.cParams._16_8_ = uVar2;
  params.cParams.strategy = ZVar3;
  params.ldmParams.enableLdm = UVar4;
  ZSTD_referenceExternalSequences(cctx,(rawSeq *)0x0,0);
  auVar5 = (undefined1  [120])params._8_120_;
  uVar1 = params.cParams._16_8_;
  uVar2 = params.cParams._8_8_;
  ZVar3 = params.cParams.strategy;
  UVar4 = params.ldmParams.enableLdm;
  params._8_120_ = auVar5;
  auVar5 = (undefined1  [120])params._8_120_;
  params.cParams._8_8_ = uVar2;
  params.cParams._16_8_ = uVar1;
  params.cParams.strategy = ZVar3;
  params.ldmParams.enableLdm = UVar4;
  ZSTD_invalidateMatchState(&(cctx->blockState).matchState);
  auVar5 = (undefined1  [120])params._8_120_;
  uVar1 = params.cParams._16_8_;
  uVar2 = params.cParams._8_8_;
  ZVar3 = params.cParams.strategy;
  UVar4 = params.ldmParams.enableLdm;
  params._8_120_ = auVar5;
  auVar5 = (undefined1  [120])params._8_120_;
  params.cParams._8_8_ = uVar2;
  params.cParams._16_8_ = uVar1;
  params.cParams.strategy = ZVar3;
  params.ldmParams.enableLdm = UVar4;
  ZSTD_reset_compressedBlockState((cctx->blockState).prevCBlock);
  auVar5 = (undefined1  [120])params._8_120_;
  uVar1 = params.cParams._16_8_;
  uVar2 = params.cParams._8_8_;
  ZVar3 = params.cParams.strategy;
  UVar4 = params.ldmParams.enableLdm;
  params._8_120_ = auVar5;
  auVar5 = (undefined1  [120])params._8_120_;
  params.cParams._8_8_ = uVar2;
  params.cParams._16_8_ = uVar1;
  params.cParams.strategy = ZVar3;
  params.ldmParams.enableLdm = UVar4;
  XXH64_reset(&cctx->xxhState,0);
  return 0;
}

Assistant:

static size_t ZSTD_continueCCtx(ZSTD_CCtx* cctx, ZSTD_CCtx_params params, U64 pledgedSrcSize)
{
    size_t const windowSize = MAX(1, (size_t)MIN(((U64)1 << params.cParams.windowLog), pledgedSrcSize));
    size_t const blockSize = MIN(ZSTD_BLOCKSIZE_MAX, windowSize);
    DEBUGLOG(4, "ZSTD_continueCCtx: re-use context in place");

    cctx->blockSize = blockSize;   /* previous block size could be different even for same windowLog, due to pledgedSrcSize */
    cctx->appliedParams = params;
    cctx->blockState.matchState.cParams = params.cParams;
    cctx->pledgedSrcSizePlusOne = pledgedSrcSize+1;
    cctx->consumedSrcSize = 0;
    cctx->producedCSize = 0;
    if (pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN)
        cctx->appliedParams.fParams.contentSizeFlag = 0;
    DEBUGLOG(4, "pledged content size : %u ; flag : %u",
        (U32)pledgedSrcSize, cctx->appliedParams.fParams.contentSizeFlag);
    cctx->stage = ZSTDcs_init;
    cctx->dictID = 0;
    if (params.ldmParams.enableLdm)
        ZSTD_window_clear(&cctx->ldmState.window);
    ZSTD_referenceExternalSequences(cctx, NULL, 0);
    ZSTD_invalidateMatchState(&cctx->blockState.matchState);
    ZSTD_reset_compressedBlockState(cctx->blockState.prevCBlock);
    XXH64_reset(&cctx->xxhState, 0);
    return 0;
}